

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_reset(REF_INTERP ref_interp)

{
  int max;
  int local_20;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT node_max;
  REF_INTERP ref_interp_local;
  
  max = ref_interp->to_grid->node->max;
  local_20 = 0;
  while( true ) {
    if (ref_interp->max <= local_20) {
      if ((ref_interp->max < max) &&
         (ref_interp_local._4_4_ = ref_interp_resize(ref_interp,max), ref_interp_local._4_4_ != 0))
      {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xe4,"ref_interp_reset",(ulong)ref_interp_local._4_4_,"protective resize");
      }
      else {
        for (local_20 = 0; local_20 < ref_interp->max; local_20 = local_20 + 1) {
          ref_interp->cell[local_20] = -1;
        }
        for (local_20 = 0; local_20 < ref_interp->max; local_20 = local_20 + 1) {
          ref_interp->part[local_20] = -1;
        }
        ref_interp_local._4_4_ = 0;
      }
      return ref_interp_local._4_4_;
    }
    if (ref_interp->agent_hired[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xe1,
         "ref_interp_reset","agent should not be hired during reset");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_interp_reset(REF_INTERP ref_interp) {
  REF_INT node_max =
      ref_node_max(ref_grid_node(ref_interp_to_grid(ref_interp)));
  REF_INT node;
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    RAS(!ref_interp->agent_hired[node],
        "agent should not be hired during reset");
  }
  if (node_max > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, node_max), "protective resize");
  }
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    ref_interp->part[node] = REF_EMPTY;
  }

  return REF_SUCCESS;
}